

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixMatrix.h
# Opt level: O0

void Eigen::internal::
     generic_product_impl<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>,Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>,Eigen::DenseShape,Eigen::DenseShape,8>
     ::scaleAndAddTo<Eigen::Matrix<double,_1,_1,0,_1,_1>>
               (Matrix<double,__1,__1,_0,__1,__1> *dst,
               Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *a_lhs,
               Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *a_rhs,Scalar *alpha)

{
  Index IVar1;
  Index IVar2;
  gemm_blocking_space<0,_double,_double,__1,__1,__1,_1,_false> *pgVar3;
  gemm_functor<double,_long,_Eigen::internal::general_matrix_matrix_product<long,_double,_1,_false,_double,_1,_false,_0>,_Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::gemm_blocking_space<0,_double,_double,__1,__1,__1,_1,_false>_>
  *func;
  double *in_RCX;
  Matrix<double,__1,__1,_0,__1,__1> *in_RDI;
  bool bVar4;
  Scalar SVar5;
  double cols;
  BlockingType blocking;
  Scalar actualAlpha;
  type rhs;
  type lhs;
  XprType *in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff08;
  undefined1 l3_blocking;
  Index in_stack_ffffffffffffff10;
  double depth;
  gemm_functor<double,_long,_Eigen::internal::general_matrix_matrix_product<long,_double,_1,_false,_double,_1,_false,_0>,_Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::gemm_blocking_space<0,_double,_double,__1,__1,__1,_1,_false>_>
  local_98;
  gemm_blocking_space<0,_double,_double,__1,__1,__1,_1,_false> local_70;
  double local_38;
  Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_30;
  Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_28;
  double *local_20;
  Matrix<double,__1,__1,_0,__1,__1> *local_8;
  
  l3_blocking = (undefined1)((ulong)in_stack_ffffffffffffff08 >> 0x38);
  local_20 = in_RCX;
  local_8 = in_RDI;
  IVar1 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x165c14);
  IVar2 = Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    ((Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x165c26);
  bVar4 = false;
  if (IVar1 == IVar2) {
    IVar1 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                      ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x165c46);
    IVar2 = Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                      ((Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x165c58);
    bVar4 = IVar1 == IVar2;
  }
  if (bVar4) {
    IVar1 = Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                      ((Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x165ca2);
    if (((IVar1 != 0) &&
        (IVar1 = Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                           ((Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x165cb5),
        IVar1 != 0)) &&
       (IVar1 = Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                          ((Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x165cc8),
       IVar1 != 0)) {
      local_28.m_matrix =
           (non_const_type)
           blas_traits<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>::extract
                     (in_stack_fffffffffffffef8);
      local_30.m_matrix =
           (non_const_type)
           blas_traits<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>::extract
                     (in_stack_fffffffffffffef8);
      depth = *local_20;
      SVar5 = blas_traits<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>::
              extractScalarFactor((XprType *)0x165d1c);
      cols = depth * SVar5;
      SVar5 = blas_traits<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>::
              extractScalarFactor((XprType *)0x165d3c);
      local_38 = cols * SVar5;
      IVar1 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                        ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x165d5f);
      pgVar3 = (gemm_blocking_space<0,_double,_double,__1,__1,__1,_1,_false> *)
               PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                         ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x165d71);
      Transpose<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                ((Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x165d88);
      gemm_blocking_space<0,_double,_double,_-1,_-1,_-1,_1,_false>::gemm_blocking_space
                (pgVar3,IVar1,(Index)cols,(Index)depth,in_stack_ffffffffffffff10,(bool)l3_blocking);
      gemm_functor<double,_long,_Eigen::internal::general_matrix_matrix_product<long,_double,_1,_false,_double,_1,_false,_0>,_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::internal::gemm_blocking_space<0,_double,_double,_-1,_-1,_-1,_1,_false>_>
      ::gemm_functor(&local_98,&local_28,&local_30,local_8,&local_38,&local_70);
      func = (gemm_functor<double,_long,_Eigen::internal::general_matrix_matrix_product<long,_double,_1,_false,_double,_1,_false,_0>,_Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::gemm_blocking_space<0,_double,_double,__1,__1,__1,_1,_false>_>
              *)Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                          ((Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x165dee);
      IVar1 = Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                        ((Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x165e02);
      pgVar3 = (gemm_blocking_space<0,_double,_double,__1,__1,__1,_1,_false> *)
               Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                         ((Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x165e16);
      parallelize_gemm<true,Eigen::internal::gemm_functor<double,long,Eigen::internal::general_matrix_matrix_product<long,double,1,false,double,1,false,0>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::gemm_blocking_space<0,double,double,_1,_1,_1,1,false>>,long>
                (func,IVar1,(long)pgVar3,(long)in_stack_fffffffffffffef8,false);
      gemm_blocking_space<0,_double,_double,_-1,_-1,_-1,_1,_false>::~gemm_blocking_space(pgVar3);
    }
    return;
  }
  __assert_fail("dst.rows()==a_lhs.rows() && dst.cols()==a_rhs.cols()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/products/GeneralMatrixMatrix.h"
                ,0x1cc,
                "static void Eigen::internal::generic_product_impl<Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Eigen::Transpose<Eigen::Matrix<double, -1, -1>>>::scaleAndAddTo(Dest &, const Lhs &, const Rhs &, const Scalar &) [Lhs = Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Rhs = Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, LhsShape = Eigen::DenseShape, RhsShape = Eigen::DenseShape, ProductType = 8, Dest = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

static void scaleAndAddTo(Dest& dst, const Lhs& a_lhs, const Rhs& a_rhs, const Scalar& alpha)
  {
    eigen_assert(dst.rows()==a_lhs.rows() && dst.cols()==a_rhs.cols());
    if(a_lhs.cols()==0 || a_lhs.rows()==0 || a_rhs.cols()==0)
      return;

    typename internal::add_const_on_value_type<ActualLhsType>::type lhs = LhsBlasTraits::extract(a_lhs);
    typename internal::add_const_on_value_type<ActualRhsType>::type rhs = RhsBlasTraits::extract(a_rhs);

    Scalar actualAlpha = alpha * LhsBlasTraits::extractScalarFactor(a_lhs)
                               * RhsBlasTraits::extractScalarFactor(a_rhs);

    typedef internal::gemm_blocking_space<(Dest::Flags&RowMajorBit) ? RowMajor : ColMajor,LhsScalar,RhsScalar,
            Dest::MaxRowsAtCompileTime,Dest::MaxColsAtCompileTime,MaxDepthAtCompileTime> BlockingType;

    typedef internal::gemm_functor<
      Scalar, Index,
      internal::general_matrix_matrix_product<
        Index,
        LhsScalar, (ActualLhsTypeCleaned::Flags&RowMajorBit) ? RowMajor : ColMajor, bool(LhsBlasTraits::NeedToConjugate),
        RhsScalar, (ActualRhsTypeCleaned::Flags&RowMajorBit) ? RowMajor : ColMajor, bool(RhsBlasTraits::NeedToConjugate),
        (Dest::Flags&RowMajorBit) ? RowMajor : ColMajor>,
      ActualLhsTypeCleaned, ActualRhsTypeCleaned, Dest, BlockingType> GemmFunctor;

    BlockingType blocking(dst.rows(), dst.cols(), lhs.cols(), 1, true);
    internal::parallelize_gemm<(Dest::MaxRowsAtCompileTime>32 || Dest::MaxRowsAtCompileTime==Dynamic)>
        (GemmFunctor(lhs, rhs, dst, actualAlpha, blocking), a_lhs.rows(), a_rhs.cols(), a_lhs.cols(), Dest::Flags&RowMajorBit);
  }